

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelloWorld.cpp
# Opt level: O2

path * findDocRoot(path *__return_storage_ptr__,string *filename)

{
  ulong uVar1;
  const_iterator pvVar2;
  bool bVar3;
  runtime_error *this;
  path *ts;
  path *ppVar4;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  path pStack_c8;
  path cp;
  iterator element;
  path local_58;
  
  ts = &pStack_c8;
  std::filesystem::current_path_abi_cxx11_();
  webfront::http::std::filesystem::__cxx11::path::string(&pStack_c8._M_pathname,&cp);
  fmt._M_str = "Looking for {} in {}";
  fmt._M_len = 0x14;
  webfront::log::info<std::__cxx11::string&,std::__cxx11::string>
            (fmt,filename,&pStack_c8._M_pathname);
  std::__cxx11::string::~string((string *)&pStack_c8);
  webfront::http::std::filesystem::__cxx11::path::~path(&cp);
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_58,filename,auto_format);
  webfront::http::std::filesystem::__cxx11::operator/(&cp,&pStack_c8,&local_58);
  bVar3 = webfront::http::std::filesystem::exists(&cp);
  webfront::http::std::filesystem::__cxx11::path::~path(&cp);
  webfront::http::std::filesystem::__cxx11::path::~path(&local_58);
  webfront::http::std::filesystem::__cxx11::path::~path(&pStack_c8);
  if (bVar3) {
    std::filesystem::current_path_abi_cxx11_();
  }
  else {
    std::filesystem::temp_directory_path_abi_cxx11_();
    webfront::http::std::filesystem::__cxx11::path::string(&pStack_c8._M_pathname,&cp);
    fmt_00._M_str = (char *)&pStack_c8;
    fmt_00._M_len = (size_t)"  not found : Looking now in temp directory {} ";
    webfront::log::info<std::__cxx11::string>((log *)0x2f,fmt_00,&ts->_M_pathname);
    std::__cxx11::string::~string((string *)&pStack_c8);
    webfront::http::std::filesystem::__cxx11::path::~path(&cp);
    std::filesystem::temp_directory_path_abi_cxx11_();
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_58,filename,auto_format);
    webfront::http::std::filesystem::__cxx11::operator/(&cp,&pStack_c8,&local_58);
    bVar3 = webfront::http::std::filesystem::exists(&cp);
    webfront::http::std::filesystem::__cxx11::path::~path(&cp);
    webfront::http::std::filesystem::__cxx11::path::~path(&local_58);
    webfront::http::std::filesystem::__cxx11::path::~path(&pStack_c8);
    if (!bVar3) {
      webfront::http::std::filesystem::__cxx11::path::path(__return_storage_ptr__);
      std::filesystem::current_path_abi_cxx11_();
      webfront::http::std::filesystem::__cxx11::path::begin(&element,&cp);
      do {
        webfront::http::std::filesystem::__cxx11::path::end((iterator *)&pStack_c8,&cp);
        bVar3 = webfront::http::std::filesystem::__cxx11::operator!=
                          (&element,(iterator *)&pStack_c8);
        if (!bVar3) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_58._M_pathname,"Cannot find ",filename);
          std::operator+(&pStack_c8._M_pathname,&local_58._M_pathname," file");
          std::runtime_error::runtime_error(this,(string *)&pStack_c8);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        ppVar4 = element._M_path;
        if (((byte)(element._M_path)->_M_cmpts & 3) == 0) {
          ppVar4 = (path *)element._M_cur;
        }
        webfront::http::std::filesystem::__cxx11::operator/
                  (&pStack_c8,__return_storage_ptr__,ppVar4);
        webfront::http::std::filesystem::__cxx11::path::operator=(__return_storage_ptr__,&pStack_c8)
        ;
        webfront::http::std::filesystem::__cxx11::path::~path(&pStack_c8);
        pvVar2 = element._M_cur;
        ppVar4 = element._M_path;
        uVar1 = *(ulong *)&(element._M_path)->_M_cmpts;
        std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
                  (&pStack_c8,(char (*) [9])"WebFront",auto_format);
        if ((uVar1 & 3) == 0) {
          ppVar4 = (path *)pvVar2;
        }
        bVar3 = webfront::http::std::filesystem::__cxx11::operator==(ppVar4,&pStack_c8);
        webfront::http::std::filesystem::__cxx11::path::~path(&pStack_c8);
        if (bVar3) {
          std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
                    (&local_58,(char (*) [4])"src",auto_format);
          webfront::http::std::filesystem::__cxx11::operator/
                    (&pStack_c8,__return_storage_ptr__,&local_58);
          webfront::http::std::filesystem::__cxx11::path::operator=
                    (__return_storage_ptr__,&pStack_c8);
          webfront::http::std::filesystem::__cxx11::path::~path(&pStack_c8);
          webfront::http::std::filesystem::__cxx11::path::~path(&local_58);
          webfront::http::std::filesystem::__cxx11::path::string
                    (&pStack_c8._M_pathname,__return_storage_ptr__);
          fmt_01._M_str = (char *)&pStack_c8;
          fmt_01._M_len = (size_t)"  not found : Looking now in source directory {}";
          webfront::log::info<std::__cxx11::string>((log *)0x30,fmt_01,&ts->_M_pathname);
          std::__cxx11::string::~string((string *)&pStack_c8);
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (&local_58,filename,auto_format);
          webfront::http::std::filesystem::__cxx11::operator/
                    (&pStack_c8,__return_storage_ptr__,&local_58);
          bVar3 = webfront::http::std::filesystem::exists(&pStack_c8);
          webfront::http::std::filesystem::__cxx11::path::~path(&pStack_c8);
          webfront::http::std::filesystem::__cxx11::path::~path(&local_58);
          if (bVar3) {
            webfront::http::std::filesystem::__cxx11::path::~path(&cp);
            return __return_storage_ptr__;
          }
        }
        if (((byte)(element._M_path)->_M_cmpts & 3) == 0) {
          element._M_cur = element._M_cur + 0x30;
        }
        else {
          element._M_at_end = true;
        }
      } while( true );
    }
    std::filesystem::temp_directory_path_abi_cxx11_();
  }
  return __return_storage_ptr__;
}

Assistant:

filesystem::path findDocRoot(string filename) {
    using namespace filesystem;

    log::info("Looking for {} in {}", filename, current_path().string());
    if (exists(current_path() / filename)) return current_path();

    log::info("  not found : Looking now in temp directory {} ", temp_directory_path().string());
    if (exists(temp_directory_path() / filename)) return temp_directory_path();

    path webfront, cp{current_path()};
    for (auto element = cp.begin(); element != cp.end(); ++element) {
        webfront = webfront / *element;
        if (*element == "WebFront") {
            webfront = webfront / "src";
            log::info("  not found : Looking now in source directory {}", webfront.string());
            if (exists(webfront / filename)) return webfront;
        }
    }

    throw runtime_error("Cannot find " + filename + " file");
}